

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O2

void * mi_heap_zalloc(mi_heap_t *heap,size_t size)

{
  void *pvVar1;
  
  pvVar1 = _mi_heap_malloc_zero(heap,size,true);
  return pvVar1;
}

Assistant:

void* mi_heap_zalloc(mi_heap_t* heap, size_t size) mi_attr_noexcept {
  return _mi_heap_malloc_zero(heap, size, true);
}